

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_reallyUndoLastTest_Test::testBody(TEST_TestRegistry_reallyUndoLastTest_Test *this)

{
  byte bVar1;
  TestRegistry *pTVar2;
  int iVar3;
  UtestShell *pUVar4;
  undefined4 extraout_var;
  TestTerminator *pTVar5;
  undefined4 extraout_var_00;
  
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[2])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1);
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[2])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2);
  pUVar4 = UtestShell::getCurrent();
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry[4])
                    ();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(CONCAT44(extraout_var,iVar3) == 2),"CHECK",
             "myRegistry->countTests() == 2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xe6,pTVar5);
  (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry[3])();
  pUVar4 = UtestShell::getCurrent();
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry[4])
                    ();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(CONCAT44(extraout_var_00,iVar3) == 1),"CHECK",
             "myRegistry->countTests() == 1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xe8,pTVar5);
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[5])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).result)
  ;
  pUVar4 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell).field_0x32;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar1,"CHECK","test1->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xea,pTVar5);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell).field_0x32;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(bVar1 ^ 1),"CHECK","!test2->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xeb,pTVar5);
  return;
}

Assistant:

TEST(TestRegistry, reallyUndoLastTest)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(myRegistry->countTests() == 2);
    myRegistry->unDoLastAddTest();
    CHECK(myRegistry->countTests() == 1);
    myRegistry->runAllTests(*result);
    CHECK(test1->hasRun_);
    CHECK(!test2->hasRun_);
}